

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructuresOperators.cpp
# Opt level: O2

ostream * operator<<(ostream *outs,Point *point)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(outs,"{");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,point->x);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,point->y);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,point->z);
  std::operator<<(poVar1,"}");
  return outs;
}

Assistant:

std::ostream& operator<<(std::ostream& outs, Point const& point)
{
  outs << "{" << point.x << " " << point.y << " " << point.z << "}";
  return outs;
}